

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<custom_arg_formatter,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<custom_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *handler)

{
  ulong uVar1;
  basic_buffer<char> *pbVar2;
  size_t sVar3;
  bool bVar4;
  internal iVar5;
  internal *piVar6;
  void *pvVar7;
  format_handler<custom_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_00;
  unsigned_long __n2_3;
  internal *end;
  char *message;
  type size_1;
  size_t sVar8;
  basic_buffer<char> *c;
  internal *piVar9;
  unsigned_long __n2_1;
  type size;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<custom_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             *)format_str.size_;
  end = (internal *)(format_str.data_ + (long)this);
  do {
    if (this == end) {
      return;
    }
    piVar6 = this;
    if ((*this == (internal)0x7b) ||
       (piVar6 = (internal *)memchr(this,0x7b,(long)end - (long)this), piVar9 = this,
       piVar6 != (internal *)0x0)) {
      if (this != piVar6) {
        do {
          sVar8 = (long)piVar6 - (long)this;
          pvVar7 = memchr(this,0x7d,sVar8);
          if (pvVar7 == (void *)0x0) {
            pbVar2 = (this_00->context).
                     super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                     .out_.container;
            sVar3 = pbVar2->size_;
            uVar1 = sVar3 + sVar8;
            if (pbVar2->capacity_ < uVar1) {
              (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
            }
            pbVar2->size_ = uVar1;
            if (this != piVar6) {
              memmove(pbVar2->ptr_ + sVar3,this,sVar8);
            }
            (this_00->context).
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            .out_.container = pbVar2;
            bVar4 = false;
          }
          else {
            piVar9 = (internal *)((long)pvVar7 + 1);
            if ((piVar9 == piVar6) || (*piVar9 != (internal)0x7d)) {
              error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            }
            pbVar2 = (this_00->context).
                     super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                     .out_.container;
            sVar3 = pbVar2->size_;
            uVar1 = sVar3 + ((long)piVar9 - (long)this);
            if (pbVar2->capacity_ < uVar1) {
              (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
            }
            pbVar2->size_ = uVar1;
            if (piVar9 != this) {
              memmove(pbVar2->ptr_ + sVar3,this,(long)piVar9 - (long)this);
            }
            (this_00->context).
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            .out_.container = pbVar2;
            this = (internal *)((long)pvVar7 + 2);
            bVar4 = true;
          }
        } while (bVar4);
      }
      piVar6 = piVar6 + 1;
      if (piVar6 == end) {
        error_handler::on_error((error_handler *)this_00,"invalid format string");
      }
      if (*piVar6 == (internal)0x7b) {
        pbVar2 = (this_00->context).
                 super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                 .out_.container;
        sVar3 = pbVar2->size_;
        uVar1 = sVar3 + 1;
        if (pbVar2->capacity_ < uVar1) {
          (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
        }
        pbVar2->size_ = uVar1;
        *(internal *)(pbVar2->ptr_ + sVar3) = *piVar6;
        (this_00->context).
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
        .out_.container = pbVar2;
      }
      else {
        if (*piVar6 == (internal)0x7d) {
          basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
          ::next_arg((format_arg *)&local_58.string,&this_00->context);
          (this_00->arg).type_ = local_48;
          (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
          (this_00->arg).value_.field_0.string.size = local_58.string.size;
        }
        else {
          local_58._0_8_ = this_00;
          piVar6 = (internal *)
                   parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<custom_arg_formatter,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                             ((char *)piVar6,(char *)end,
                              (id_adapter<fmt::v5::format_handler<custom_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                               *)&local_58.string);
          if (piVar6 == end) {
            iVar5 = (internal)0x0;
          }
          else {
            iVar5 = *piVar6;
          }
          if (iVar5 == (internal)0x3a) {
            piVar6 = (internal *)
                     format_handler<custom_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     ::on_format_specs(this_00,(char *)(piVar6 + 1),(char *)end);
            if ((piVar6 == end) || (*piVar6 != (internal)0x7d)) {
              message = "unknown format specifier";
              goto LAB_00108c4d;
            }
            goto LAB_00108c07;
          }
          if (iVar5 != (internal)0x7d) {
            message = "missing \'}\' in format string";
LAB_00108c4d:
            error_handler::on_error((error_handler *)this_00,message);
          }
        }
        format_handler<custom_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_replacement_field(this_00,(char *)piVar6);
      }
LAB_00108c07:
      this = piVar6 + 1;
      bVar4 = true;
    }
    else {
      do {
        sVar8 = (long)end - (long)piVar9;
        pvVar7 = memchr(piVar9,0x7d,sVar8);
        if (pvVar7 == (void *)0x0) {
          pbVar2 = (this_00->context).
                   super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                   .out_.container;
          sVar3 = pbVar2->size_;
          uVar1 = sVar3 + sVar8;
          if (pbVar2->capacity_ < uVar1) {
            (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
          }
          pbVar2->size_ = uVar1;
          if (piVar9 != end) {
            memmove(pbVar2->ptr_ + sVar3,piVar9,sVar8);
          }
          (this_00->context).
          super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
          .out_.container = pbVar2;
          bVar4 = false;
        }
        else {
          piVar6 = (internal *)((long)pvVar7 + 1);
          if ((piVar6 == end) || (*piVar6 != (internal)0x7d)) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
          }
          pbVar2 = (this_00->context).
                   super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                   .out_.container;
          sVar3 = pbVar2->size_;
          uVar1 = sVar3 + ((long)piVar6 - (long)piVar9);
          if (pbVar2->capacity_ < uVar1) {
            (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
          }
          pbVar2->size_ = uVar1;
          if (piVar6 != piVar9) {
            memmove(pbVar2->ptr_ + sVar3,piVar9,(long)piVar6 - (long)piVar9);
          }
          (this_00->context).
          super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
          .out_.container = pbVar2;
          piVar9 = (internal *)((long)pvVar7 + 2);
          bVar4 = true;
        }
      } while (bVar4);
      bVar4 = false;
    }
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}